

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::scene::CMeshCache::MeshEntry>::sort
          (array<irr::scene::CMeshCache::MeshEntry> *this)

{
  iterator __first;
  iterator __last;
  long in_RDI;
  vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
  *in_stack_ffffffffffffffd8;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    __first = std::
              vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
              ::begin(in_stack_ffffffffffffffd8);
    __last = std::
             vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
             ::end(in_stack_ffffffffffffffd8);
    ::std::
    sort<__gnu_cxx::__normal_iterator<irr::scene::CMeshCache::MeshEntry*,std::vector<irr::scene::CMeshCache::MeshEntry,std::allocator<irr::scene::CMeshCache::MeshEntry>>>>
              ((__normal_iterator<irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
                )__first._M_current,
               (__normal_iterator<irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
                )__last._M_current);
    *(undefined1 *)(in_RDI + 0x18) = 1;
  }
  return;
}

Assistant:

void sort()
	{
		if (!is_sorted) {
			std::sort(m_data.begin(), m_data.end());
			is_sorted = true;
		}
	}